

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O3

int bandit::run(int argc,char **argv)

{
  formatters fVar1;
  int iVar2;
  failure_formatter *formatter;
  bandit_run_policy *this;
  undefined *puVar3;
  char *only_pattern;
  char *skip_pattern;
  colorizer colorizer;
  options opt;
  colorizer local_49;
  listener *local_48;
  options local_40;
  
  detail::options::options(&local_40,argc,argv);
  fVar1 = detail::options::formatter(&local_40);
  formatter = (failure_formatter *)operator_new(8);
  puVar3 = &detail::default_failure_formatter::vtable;
  if (fVar1 == FORMATTER_VS) {
    puVar3 = &detail::visual_studio_failure_formatter::vtable;
  }
  formatter->_vptr_failure_formatter = (_func_int **)(puVar3 + 0x10);
  local_49.colors_enabled_ =
       local_40.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>._M_impl
       .super__Vector_impl_data._M_start[4].desc == (Descriptor *)0x0;
  detail::create_reporter((detail *)&local_48,&local_40,formatter,&local_49);
  if (local_48 != (listener *)0x0) {
    detail::registered_listener(bandit::detail::listener*)::reporter_ = local_48;
  }
  this = (bandit_run_policy *)operator_new(0x58);
  skip_pattern = local_40.options_.
                 super__Vector_base<option::Option,_std::allocator<option::Option>_>._M_impl.
                 super__Vector_impl_data._M_start[6].arg;
  if (skip_pattern == (char *)0x0) {
    skip_pattern = "";
  }
  only_pattern = local_40.options_.
                 super__Vector_base<option::Option,_std::allocator<option::Option>_>._M_impl.
                 super__Vector_impl_data._M_start[7].arg;
  if (only_pattern == (char *)0x0) {
    only_pattern = "";
  }
  detail::bandit_run_policy::bandit_run_policy
            (this,skip_pattern,only_pattern,
             local_40.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>.
             _M_impl.super__Vector_impl_data._M_start[8].desc != (Descriptor *)0x0,
             local_40.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>.
             _M_impl.super__Vector_impl_data._M_start[9].desc != (Descriptor *)0x0);
  detail::registered_run_policy(bandit::detail::run_policy*)::policy_ = this;
  if (detail::specs[abi:cxx11]()::registry_abi_cxx11_ == '\0') {
    run();
  }
  if (detail::context_stack()::contexts == '\0') {
    iVar2 = __cxa_guard_acquire(&detail::context_stack()::contexts);
    if (iVar2 != 0) {
      detail::context_stack()::contexts._64_8_ = 0;
      detail::context_stack()::contexts._72_8_ = 0;
      detail::context_stack()::contexts._48_8_ = 0;
      detail::context_stack()::contexts._56_8_ = 0;
      detail::context_stack()::contexts._32_8_ = 0;
      detail::context_stack()::contexts._40_8_ = 0;
      detail::context_stack()::contexts._16_8_ = 0;
      detail::context_stack()::contexts._24_8_ = 0;
      detail::context_stack()::contexts._0_8_ = 0;
      detail::context_stack()::contexts._8_8_ = 0;
      std::_Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>::
      _M_initialize_map((_Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
                         *)detail::context_stack()::contexts,0);
      __cxa_atexit(std::deque<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
                   ::~deque,detail::context_stack()::contexts,&__dso_handle);
      __cxa_guard_release(&detail::context_stack()::contexts);
    }
  }
  iVar2 = run(&local_40,(spec_registry *)detail::specs[abi:cxx11]()::registry_abi_cxx11_,
              (contextstack_t *)detail::context_stack()::contexts,local_48);
  (*(this->super_run_policy)._vptr_run_policy[1])(this);
  if (local_48 != (listener *)0x0) {
    (*local_48->_vptr_listener[1])();
  }
  operator_delete(formatter);
  if (local_40.options_.super__Vector_base<option::Option,_std::allocator<option::Option>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.options_.
                    super__Vector_base<option::Option,_std::allocator<option::Option>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

inline int run(int argc, char* argv[])
  {
    detail::options opt(argc, argv);
    detail::failure_formatter_ptr formatter(create_formatter(opt));
    bandit::detail::colorizer colorizer(!opt.no_color());
    detail::listener_ptr reporter(create_reporter(opt, formatter.get(), colorizer));

    detail::registered_listener(reporter.get());

    detail::run_policy_ptr run_policy = create_run_policy(opt);
    registered_run_policy(run_policy.get());

    return run(opt, detail::specs(), detail::context_stack(), *reporter);
  }